

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

void __thiscall MakefileGenerator::writeHeader(MakefileGenerator *this,QTextStream *t)

{
  QMakeProject *pQVar1;
  QString string;
  bool bVar2;
  QTextStream *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QStringView config;
  undefined8 in_stack_ffffffffffffff58;
  QArrayData *in_stack_ffffffffffffff60;
  QArrayData *pQVar6;
  storage_type_conflict *in_stack_ffffffffffffff68;
  qsizetype qStack_90;
  QString local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QTextStream::operator<<
            (t,"#############################################################################\n");
  pQVar3 = (QTextStream *)QTextStream::operator<<(t,"# Makefile for building: ");
  ProKey::ProKey((ProKey *)&stack0xffffffffffffff60,"TARGET");
  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
            (&local_70,this,(ProKey *)&stack0xffffffffffffff60);
  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])(&local_58,this,&local_70);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_58);
  Qt::endl(pQVar3);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (in_stack_ffffffffffffff60 != (QArrayData *)0x0) {
    LOCK();
    (in_stack_ffffffffffffff60->ref_)._q_value.super___atomic_base<int>._M_i =
         (in_stack_ffffffffffffff60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((in_stack_ffffffffffffff60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(in_stack_ffffffffffffff60,2,0x10);
    }
  }
  QTextStream::operator<<(t,"# Generated by qmake (3.1) (Qt 6.10.0)\n");
  pQVar3 = (QTextStream *)QTextStream::operator<<(t,"# Project:  ");
  pQVar1 = this->project;
  local_58.d.d = (pQVar1->m_projectFile).d.d;
  local_58.d.ptr = (pQVar1->m_projectFile).d.ptr;
  local_58.d.size = (pQVar1->m_projectFile).d.size;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  fileFixify((QString *)&stack0xffffffffffffff60,this,&local_58,(FileFixifyTypes)0x0,true);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&stack0xffffffffffffff60);
  Qt::endl(pQVar3);
  if (in_stack_ffffffffffffff60 != (QArrayData *)0x0) {
    LOCK();
    (in_stack_ffffffffffffff60->ref_)._q_value.super___atomic_base<int>._M_i =
         (in_stack_ffffffffffffff60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((in_stack_ffffffffffffff60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(in_stack_ffffffffffffff60,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar3 = (QTextStream *)QTextStream::operator<<(t,"# Template: ");
  ProKey::ProKey((ProKey *)&stack0xffffffffffffff60,"TEMPLATE");
  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
            (&local_58,this,(ProKey *)&stack0xffffffffffffff60);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_58);
  Qt::endl(pQVar3);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (in_stack_ffffffffffffff60 != (QArrayData *)0x0) {
    LOCK();
    (in_stack_ffffffffffffff60->ref_)._q_value.super___atomic_base<int>._M_i =
         (in_stack_ffffffffffffff60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((in_stack_ffffffffffffff60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(in_stack_ffffffffffffff60,2,0x10);
    }
  }
  pQVar1 = this->project;
  QVar5.m_data = (storage_type *)0xa;
  QVar5.m_size = (qsizetype)&stack0xffffffffffffff60;
  QString::fromUtf8(QVar5);
  config.m_data = in_stack_ffffffffffffff68;
  config.m_size = qStack_90;
  pQVar6 = in_stack_ffffffffffffff60;
  bVar2 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
  if (in_stack_ffffffffffffff60 != (QArrayData *)0x0) {
    LOCK();
    (in_stack_ffffffffffffff60->ref_)._q_value.super___atomic_base<int>._M_i =
         (in_stack_ffffffffffffff60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((in_stack_ffffffffffffff60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(in_stack_ffffffffffffff60,2,0x10);
    }
  }
  if (!bVar2) {
    pQVar3 = (QTextStream *)QTextStream::operator<<(t,"# Command: ");
    ProKey::ProKey((ProKey *)&stack0xffffffffffffff60,"QMAKE_QMAKE");
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
              (&local_58,this,(ProKey *)&stack0xffffffffffffff60);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_58);
    fullBuildArgs(&local_70,this);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_70);
    Qt::endl(pQVar3);
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar6,2,0x10);
      }
    }
  }
  QTextStream::operator<<
            (t,"#############################################################################\n");
  Qt::endl(t);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::fileName();
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  string.d.ptr = (char16_t *)local_70.d.d;
  string.d.d = (Data *)in_stack_ffffffffffffff58;
  string.d.size = (qsizetype)local_70.d.ptr;
  pQVar6 = &(local_70.d.d)->super_QArrayData;
  Option::fixString(&local_58,string,(uchar)&stack0xffffffffffffff60);
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar6,2,0x10);
    }
  }
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
    }
  }
  lVar4 = QString::lastIndexOf((QString *)&local_58,0x2e5bf0,(CaseSensitivity)local_58.d.size);
  if (lVar4 != -1) {
    QString::lastIndexOf((QString *)&local_58,0x2e5bf0,(CaseSensitivity)local_58.d.size);
    QString::remove((longlong)&local_58,0);
  }
  pQVar3 = (QTextStream *)QTextStream::operator<<(t,"MAKEFILE      = ");
  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
            (&stack0xffffffffffffff60,this,&local_58);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&stack0xffffffffffffff60);
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  Qt::endl(pQVar3);
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar6,2,0x10);
    }
  }
  QTextStream::operator<<(t,"EQ            = =\n\n");
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
MakefileGenerator::writeHeader(QTextStream &t)
{
    t << "#############################################################################\n";
    t << "# Makefile for building: " << escapeFilePath(var("TARGET")) << Qt::endl;
    t << "# Generated by qmake (" QMAKE_VERSION_STR ") (Qt " QT_VERSION_STR ")\n";
    t << "# Project:  " << fileFixify(project->projectFile()) << Qt::endl;
    t << "# Template: " << var("TEMPLATE") << Qt::endl;
    if(!project->isActiveConfig("build_pass"))
        t << "# Command: " << var("QMAKE_QMAKE") << fullBuildArgs() << Qt::endl;
    t << "#############################################################################\n";
    t << Qt::endl;
    QString ofile = Option::fixPathToTargetOS(Option::output.fileName());
    if (ofile.lastIndexOf(Option::dir_sep) != -1)
        ofile.remove(0, ofile.lastIndexOf(Option::dir_sep) +1);
    t << "MAKEFILE      = " << escapeFilePath(ofile) << Qt::endl << Qt::endl;
    t << "EQ            = =\n\n";
}